

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O0

int prepare_symbol(internal_binding_t *binding)

{
  FILE *pFVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  char *local_b8;
  char *local_98;
  char *local_90;
  char *local_80;
  char *local_60;
  void *local_40;
  void *symbol;
  library_t *int_library;
  gotcha_binding_t *user_binding;
  link_map *lib;
  internal_binding_t *piStack_18;
  int result;
  internal_binding_t *binding_local;
  
  pFVar1 = _stderr;
  lib._4_4_ = 0;
  user_binding = (gotcha_binding_t *)0x0;
  int_library = (library_t *)binding->user_binding;
  piStack_18 = binding;
  if (1 < debug_level) {
    uVar2 = gotcha_gettid();
    uVar3 = getpid();
    local_60 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha.c"
                       ,0x2f);
    if (local_60 == (char *)0x0) {
      local_60 = "";
    }
    fprintf(pFVar1,"[%d/%d][%s:%u] - Looking up exported symbols for %s\n",(ulong)uVar2,(ulong)uVar3
            ,local_60 + 1,0x67,int_library->map);
  }
  user_binding = ___throw_regex_error;
  while( true ) {
    pFVar1 = _stderr;
    if (user_binding == (gotcha_binding_t *)0x0) {
      if (0 < debug_level) {
        uVar2 = gotcha_gettid();
        uVar3 = getpid();
        local_b8 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha.c"
                           ,0x2f);
        if (local_b8 == (char *)0x0) {
          local_b8 = "";
        }
        fprintf(pFVar1,"[%d/%d][%s:%u] - Symbol %s was found in program\n",(ulong)uVar2,(ulong)uVar3
                ,local_b8 + 1,0x75,int_library->map);
      }
      return -1;
    }
    symbol = get_library((link_map *)user_binding);
    pFVar1 = _stderr;
    if ((library_t *)symbol == (library_t *)0x0) {
      if (2 < debug_level) {
        uVar2 = gotcha_gettid();
        uVar3 = getpid();
        local_80 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha.c"
                           ,0x2f);
        if (local_80 == (char *)0x0) {
          local_80 = "";
        }
        if (user_binding->wrapper_pointer == (void *)0x0) {
          local_90 = "[NULL]";
        }
        else {
          if (*user_binding->wrapper_pointer == '\0') {
            local_98 = "[EMPTY]";
          }
          else {
            local_98 = (char *)user_binding->wrapper_pointer;
          }
          local_90 = local_98;
        }
        fprintf(pFVar1,"[%d/%d][%s:%u] - Creating new library object for %s\n",(ulong)uVar2,
                (ulong)uVar3,local_80 + 1,0x6b,local_90);
      }
      symbol = add_library((link_map *)user_binding);
    }
    lVar4 = lookup_exported_symbol((char *)int_library->map,(link_map *)user_binding,&local_40);
    lib._4_4_ = (int)lVar4;
    if (lib._4_4_ != -1) break;
    user_binding = (gotcha_binding_t *)user_binding[1].name;
    lib._4_4_ = 0xffffffff;
  }
  setInternalBindingAddressPointer(&int_library->prev->map,local_40);
  return 0;
}

Assistant:

int prepare_symbol(struct internal_binding_t *binding) {
  int result = 0;
  struct link_map *lib = NULL;
  struct gotcha_binding_t *user_binding = binding->user_binding;

  debug_printf(2, "Looking up exported symbols for %s\n", user_binding->name);
  for (lib = _r_debug.r_map; lib != 0; lib = lib->l_next) {
    struct library_t *int_library = get_library(lib);
    if (!int_library) {
      debug_printf(3, "Creating new library object for %s\n", LIB_NAME(lib));
      int_library = add_library(lib);
    }
    void *symbol;
    result = lookup_exported_symbol(user_binding->name, lib, &symbol);
    if (result != -1) {
      setInternalBindingAddressPointer(user_binding->function_handle, symbol);
      return 0;
    }
  }
  debug_printf(1, "Symbol %s was found in program\n", user_binding->name);
  return -1;
}